

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::cpp::MessageGenerator::NeedsIsInitialized(MessageGenerator *this)

{
  pointer ppFVar1;
  char cVar2;
  bool bVar3;
  FieldGenerator *pFVar4;
  FieldDescriptor *field;
  Options *in_RCX;
  pointer ppFVar5;
  bool bVar6;
  Iterator __begin4;
  Iterator __end4;
  Iterator __begin3;
  Iterator __end3;
  Iterator local_80;
  Iterator local_70;
  string local_60;
  Iterator local_40;
  
  SimpleBaseClass_abi_cxx11_
            (&local_60,(cpp *)this->descriptor_,(Descriptor *)&this->options_,in_RCX);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_60._M_dataplus._M_p._4_4_,(int)local_60._M_dataplus._M_p) !=
      &local_60.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_60._M_dataplus._M_p._4_4_,(int)local_60._M_dataplus._M_p),
                    local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_60._M_string_length == 0) {
    bVar3 = true;
    if (this->num_required_fields_ == 0 && this->descriptor_->extension_range_count_ == 0) {
      ppFVar5 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppFVar1 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      bVar6 = ppFVar5 == ppFVar1;
      if (!bVar6) {
        pFVar4 = FieldGeneratorTable::get(&this->field_generators_,*ppFVar5);
        cVar2 = (**(code **)((long)((pFVar4->impl_)._M_t.
                                    super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
                                    .
                                    super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_false>
                                   ._M_head_impl)->_vptr_FieldGeneratorBase + 0xd8))();
        while (cVar2 == '\0') {
          ppFVar5 = ppFVar5 + 1;
          bVar6 = ppFVar5 == ppFVar1;
          if (bVar6) break;
          pFVar4 = FieldGeneratorTable::get(&this->field_generators_,*ppFVar5);
          cVar2 = (**(code **)((long)((pFVar4->impl_)._M_t.
                                      super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
                                      .
                                      super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_false>
                                     ._M_head_impl)->_vptr_FieldGeneratorBase + 0xd8))();
        }
      }
      if ((bVar6) && (this->num_weak_fields_ == 0)) {
        local_60._M_string_length = (size_type)this->descriptor_;
        local_60._M_dataplus._M_p._0_4_ = 0;
        local_40.idx = ((Descriptor *)local_60._M_string_length)->real_oneof_decl_count_;
        local_40.descriptor = (Descriptor *)local_60._M_string_length;
        bVar3 = cpp::operator==((Iterator *)&local_60,&local_40);
        if (!bVar3) {
          do {
            local_80.descriptor = OneOfRangeImpl::Iterator::operator*((Iterator *)&local_60);
            local_80.idx = 0;
            local_70.idx = (local_80.descriptor)->field_count_;
            local_70.descriptor = local_80.descriptor;
            while (bVar6 = protobuf::internal::operator==(&local_80,&local_70), !bVar6) {
              field = protobuf::internal::FieldRangeImpl<google::protobuf::OneofDescriptor>::
                      Iterator::operator*(&local_80);
              pFVar4 = FieldGeneratorTable::get(&this->field_generators_,field);
              cVar2 = (**(code **)((long)((pFVar4->impl_)._M_t.
                                          super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
                                          .
                                          super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_false>
                                         ._M_head_impl)->_vptr_FieldGeneratorBase + 0xd8))();
              if (cVar2 != '\0') {
                if (!bVar6) goto LAB_00dee652;
                break;
              }
              local_80.idx = local_80.idx + 1;
            }
            local_60._M_dataplus._M_p._0_4_ = (int)local_60._M_dataplus._M_p + 1;
            bVar3 = cpp::operator==((Iterator *)&local_60,&local_40);
          } while (!bVar3);
        }
LAB_00dee652:
        bVar3 = (bool)(bVar3 ^ 1);
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool MessageGenerator::NeedsIsInitialized() {
  if (HasSimpleBaseClass(descriptor_, options_)) return false;
  if (descriptor_->extension_range_count() != 0) return true;
  if (num_required_fields_ != 0) return true;

  for (const auto* field : optimized_order_) {
    if (field_generators_.get(field).NeedsIsInitialized()) return true;
  }
  if (num_weak_fields_ != 0) return true;

  for (const auto* oneof : OneOfRange(descriptor_)) {
    for (const auto* field : FieldRange(oneof)) {
      if (field_generators_.get(field).NeedsIsInitialized()) return true;
    }
  }

  return false;
}